

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

JavascriptString *
Js::JavascriptArray::JoinArrayHelper<Js::JavascriptNativeIntArray>
          (JavascriptNativeIntArray *arr,JavascriptString *separator,ScriptContext *scriptContext)

{
  CharCount initialPointerCapacity;
  code *pcVar1;
  Var pvVar2;
  bool bVar3;
  charcount_t cVar4;
  BOOL BVar5;
  ThreadContext *threadContext;
  undefined4 *puVar6;
  uint *puVar7;
  JavascriptLibrary *pJVar8;
  JavascriptString *pJVar9;
  JavascriptNativeIntArray *local_140;
  int local_d4;
  Var pvStack_b0;
  BOOL gotItem_2;
  Var item_2;
  JavascriptString *itemString;
  Var item_1;
  JavascriptString *res;
  undefined1 local_85;
  BOOL gotItem_1;
  uint uStack_80;
  bool hasSeparator_1;
  BOOL local_7c;
  uint32 i;
  BOOL gotItem;
  Var item;
  CompoundString *cs;
  CharCount local_60;
  byte local_59;
  charcount_t estimatedAppendCount;
  bool hasSeparator;
  uint32 arrLength;
  undefined1 local_48 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  JavascriptString *separator_local;
  JavascriptNativeIntArray *arr_local;
  
  jsReentLock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_48,threadContext);
  JsReentLock::setObjectForMutation((JsReentLock *)local_48,arr);
  bVar3 = VirtualTableInfo<Js::JavascriptNativeIntArray>::HasVirtualTable(arr);
  if ((!bVar3) &&
     (bVar3 = VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeIntArray>_>::HasVirtualTable
                        (arr), !bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1219,
                                "(VirtualTableInfo<T>::HasVirtualTable(arr) || VirtualTableInfo<CrossSiteObject<T>>::HasVirtualTable(arr))"
                                ,
                                "VirtualTableInfo<T>::HasVirtualTable(arr) || VirtualTableInfo<CrossSiteObject<T>>::HasVirtualTable(arr)"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  estimatedAppendCount =
       (arr->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.length;
  if (estimatedAppendCount != 0) {
    if (estimatedAppendCount != 1) {
      if (estimatedAppendCount == 2) {
        cVar4 = JavascriptString::GetLength(separator);
        local_85 = cVar4 != 0;
        if (!(bool)local_85) {
          item_1 = (Var)0x0;
          JsReentLock::unlock((JsReentLock *)local_48);
          res._4_4_ = TemplatedGetItem<Js::JavascriptNativeIntArray>
                                (arr,0,&itemString,(ScriptContext *)jsReentLock._24_8_,true);
          JsReentLock::MutateArrayObject((JsReentLock *)local_48);
          JsReentLock::relock((JsReentLock *)local_48);
          if (res._4_4_ != 0) {
            JsReentLock::unlock((JsReentLock *)local_48);
            item_1 = JoinToString(itemString,(ScriptContext *)jsReentLock._24_8_);
            JsReentLock::MutateArrayObject((JsReentLock *)local_48);
            JsReentLock::relock((JsReentLock *)local_48);
          }
          JsReentLock::unlock((JsReentLock *)local_48);
          res._4_4_ = TryTemplatedGetItem<Js::JavascriptNativeIntArray,unsigned_int>
                                ((RecyclableObject *)arr,1,&itemString,
                                 (ScriptContext *)jsReentLock._24_8_,true);
          JsReentLock::MutateArrayObject((JsReentLock *)local_48);
          JsReentLock::relock((JsReentLock *)local_48);
          if (res._4_4_ != 0) {
            JsReentLock::unlock((JsReentLock *)local_48);
            item_2 = JoinToString(itemString,(ScriptContext *)jsReentLock._24_8_);
            JsReentLock::MutateArrayObject((JsReentLock *)local_48);
            JsReentLock::relock((JsReentLock *)local_48);
            if (item_1 == (Var)0x0) {
              local_140 = (JavascriptNativeIntArray *)item_2;
            }
            else {
              local_140 = (JavascriptNativeIntArray *)
                          ConcatString::New((JavascriptString *)item_1,(JavascriptString *)item_2);
            }
            arr_local = local_140;
            goto LAB_0111200f;
          }
          if (item_1 != (Var)0x0) {
            arr_local = (JavascriptNativeIntArray *)item_1;
            goto LAB_0111200f;
          }
          goto LAB_01111fe3;
        }
      }
      cVar4 = JavascriptString::GetLength(separator);
      local_59 = cVar4 != 0;
      if ((bool)local_59) {
        local_d4 = estimatedAppendCount - 1;
      }
      else {
        local_d4 = 0;
      }
      cs._4_4_ = estimatedAppendCount + local_d4;
      puVar7 = min<unsigned_int>(&Join_MaxEstimatedAppendCount,(uint *)((long)&cs + 4));
      initialPointerCapacity = *puVar7;
      local_60 = initialPointerCapacity;
      pJVar8 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
      item = CompoundString::NewWithPointerCapacity(initialPointerCapacity,pJVar8);
      JsReentLock::unlock((JsReentLock *)local_48);
      local_7c = TemplatedGetItem<Js::JavascriptNativeIntArray>
                           (arr,0,(Var *)&i,(ScriptContext *)jsReentLock._24_8_,true);
      JsReentLock::MutateArrayObject((JsReentLock *)local_48);
      JsReentLock::relock((JsReentLock *)local_48);
      if (local_7c != 0) {
        JsReentLock::unlock((JsReentLock *)local_48);
        pvVar2 = item;
        pJVar9 = JoinToString(_i,(ScriptContext *)jsReentLock._24_8_);
        CompoundString::Append((CompoundString *)pvVar2,pJVar9);
        JsReentLock::MutateArrayObject((JsReentLock *)local_48);
        JsReentLock::relock((JsReentLock *)local_48);
      }
      for (uStack_80 = 1; uStack_80 < estimatedAppendCount; uStack_80 = uStack_80 + 1) {
        if ((local_59 & 1) != 0) {
          CompoundString::Append((CompoundString *)item,separator);
        }
        JsReentLock::unlock((JsReentLock *)local_48);
        local_7c = TryTemplatedGetItem<Js::JavascriptNativeIntArray,unsigned_int>
                             ((RecyclableObject *)arr,uStack_80,(Var *)&i,
                              (ScriptContext *)jsReentLock._24_8_,true);
        JsReentLock::MutateArrayObject((JsReentLock *)local_48);
        JsReentLock::relock((JsReentLock *)local_48);
        if (local_7c != 0) {
          JsReentLock::unlock((JsReentLock *)local_48);
          pvVar2 = item;
          pJVar9 = JoinToString(_i,(ScriptContext *)jsReentLock._24_8_);
          CompoundString::Append((CompoundString *)pvVar2,pJVar9);
          JsReentLock::MutateArrayObject((JsReentLock *)local_48);
          JsReentLock::relock((JsReentLock *)local_48);
        }
      }
      arr_local = (JavascriptNativeIntArray *)item;
      goto LAB_0111200f;
    }
    JsReentLock::unlock((JsReentLock *)local_48);
    BVar5 = TemplatedGetItem<Js::JavascriptNativeIntArray>
                      (arr,0,&stack0xffffffffffffff50,(ScriptContext *)jsReentLock._24_8_,true);
    JsReentLock::MutateArrayObject((JsReentLock *)local_48);
    JsReentLock::relock((JsReentLock *)local_48);
    if (BVar5 != 0) {
      JsReentLock::unlock((JsReentLock *)local_48);
      arr_local = (JavascriptNativeIntArray *)
                  JoinToString(pvStack_b0,(ScriptContext *)jsReentLock._24_8_);
      goto LAB_0111200f;
    }
  }
LAB_01111fe3:
  pJVar8 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
  arr_local = (JavascriptNativeIntArray *)JavascriptLibrary::GetEmptyString(pJVar8);
LAB_0111200f:
  gotItem_1 = 1;
  JsReentLock::~JsReentLock((JsReentLock *)local_48);
  return (JavascriptString *)arr_local;
}

Assistant:

JavascriptString* JavascriptArray::JoinArrayHelper(T * arr, JavascriptString* separator, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arr);

        Assert(VirtualTableInfo<T>::HasVirtualTable(arr) || VirtualTableInfo<CrossSiteObject<T>>::HasVirtualTable(arr));
        const uint32 arrLength = arr->length;
        switch(arrLength)
        {
            default:
            {
CaseDefault:
                bool hasSeparator = (separator->GetLength() != 0);
                const charcount_t estimatedAppendCount =
                    min(
                        Join_MaxEstimatedAppendCount,
                        static_cast<charcount_t>(arrLength + (hasSeparator ? arrLength - 1 : 0)));
                CompoundString *const cs =
                    CompoundString::NewWithPointerCapacity(estimatedAppendCount, scriptContext->GetLibrary());
                Var item;
                BOOL gotItem;
                JS_REENTRANT(jsReentLock, gotItem = TemplatedGetItem(arr, 0u, &item, scriptContext));
                if (gotItem)
                {
                    JS_REENTRANT(jsReentLock, cs->Append(JavascriptArray::JoinToString(item, scriptContext)));
                }

                for (uint32 i = 1; i < arrLength; i++)
                {
                    if (hasSeparator)
                    {
                        cs->Append(separator);
                    }

                    JS_REENTRANT(jsReentLock, gotItem = TryTemplatedGetItem<T>(arr, i, &item, scriptContext));
                    if (gotItem)
                    {
                        JS_REENTRANT(jsReentLock, cs->Append(JavascriptArray::JoinToString(item, scriptContext)));
                    }
                }
                return cs;
            }

            case 2:
            {
                bool hasSeparator = (separator->GetLength() != 0);
                BOOL gotItem;
                if(hasSeparator)
                {
                    goto CaseDefault;
                }

                JavascriptString *res = nullptr;
                Var item;

                JS_REENTRANT(jsReentLock, gotItem = TemplatedGetItem(arr, 0u, &item, scriptContext));
                if (gotItem)
                {
                    JS_REENTRANT(jsReentLock, res = JavascriptArray::JoinToString(item, scriptContext));
                }
                JS_REENTRANT(jsReentLock, gotItem = TryTemplatedGetItem<T>(arr, 1u, &item, scriptContext));
                if (gotItem)
                {
                    JS_REENTRANT(jsReentLock, JavascriptString *const itemString = JavascriptArray::JoinToString(item, scriptContext));
                    return res ? ConcatString::New(res, itemString) : itemString;
                }

                if(res)
                {
                    return res;
                }

                goto Case0;
            }

            case 1:
            {
                Var item;
                BOOL gotItem;
                JS_REENTRANT(jsReentLock, gotItem = TemplatedGetItem(arr, 0u, &item, scriptContext));
                if (gotItem)
                {
                    JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::JoinToString(item, scriptContext));
                }
                // fall through
            }

            case 0:
Case0:
                return scriptContext->GetLibrary()->GetEmptyString();
        }
    }